

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O1

uint ** gf_matr_inv(uint **a,uint a_rows,uint a_cols)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  uint **a_00;
  uint **ppuVar5;
  undefined4 extraout_var;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  
  if (a_rows == 2 || a_rows == a_cols) {
    uVar3 = gf_matr_det(a,a_rows,a_cols);
    a_00 = matrix_copy(a,a_rows,a_cols);
    ppuVar5 = matrix_new(a_rows,a_cols);
    puVar1 = a_00[1];
    uVar10 = **a_00;
    **a_00 = puVar1[1];
    puVar1[1] = uVar10;
    if (a_rows != 0) {
      uVar8 = 0;
      do {
        if (a_cols != 0) {
          puVar1 = a_00[uVar8];
          puVar2 = ppuVar5[uVar8];
          uVar9 = 0;
          do {
            uVar7 = (ulong)puVar1[uVar9];
            if (uVar7 != 0 && uVar3 != 0) {
              iVar6 = index_of[uVar7] - index_of[uVar3];
              iVar4 = iVar6 + 0xff;
              if (-1 < iVar6) {
                iVar4 = iVar6;
              }
              uVar10 = alpha_of[iVar4];
            }
            else {
              uVar10 = -(uint)(uVar7 != 0);
            }
            puVar2[uVar9] = uVar10;
            uVar9 = uVar9 + 1;
          } while (a_cols != uVar9);
        }
        uVar8 = uVar8 + 1;
        uVar10 = a_cols;
      } while (uVar8 != a_rows);
    }
    matrix_free(a_00,a_rows,uVar10);
    return ppuVar5;
  }
  gf_matr_inv_cold_1();
  test_n = test_n + 1;
  iVar4 = printf("test %d failed\n");
  return (uint **)CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
}

Assistant:

uint32_t **gf_matr_inv(uint32_t **a, uint32_t a_rows, uint32_t a_cols)
{
    if (a_rows != a_cols && a_rows != 2)
        fatal("gf_matr_inv", "Ainv only for 2x2 matrices\n");

    uint32_t det = gf_matr_det(a, a_rows, a_cols);

    uint32_t **a0 = matrix_copy(a, a_rows, a_cols);
    uint32_t **a0inv = matrix_new(a_rows, a_cols);

    swap(&a0[0][0], &a0[1][1]);

    for (uint32_t i = 0; i < a_rows; i++)
        for (uint32_t j = 0; j < a_cols; j++)
            a0inv[i][j] = gf_div(a0[i][j], det);

    matrix_free(a0, a_rows, a_cols);

    return a0inv;
}